

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_generic_section.hpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::
generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::end_object(generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
             *this)

{
  error_code eVar1;
  error_or<pstore::repo::section_content_*> c;
  _Head_base<0UL,_pstore::repo::generic_section_creation_dispatcher_*,_false> local_38;
  _Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false> local_30;
  error_or<pstore::repo::section_content_*> local_28;
  
  content_object(&local_28,this);
  if (local_28.has_error_ == true) {
    eVar1 = error_or<pstore::repo::section_content_*>::get_error(&local_28);
  }
  else {
    error_or<pstore::repo::section_content*>::
    value_storage_impl<pstore::error_or<pstore::repo::section_content*>const&,pstore::repo::section_content*const>
              (&local_28);
    std::
    make_unique<pstore::repo::generic_section_creation_dispatcher,pstore::repo::section_kind_const&,pstore::repo::section_content*const&>
              ((section_kind *)&local_38,(section_content **)&this->kind_);
    local_30._M_head_impl = &(local_38._M_head_impl)->super_section_creation_dispatcher;
    local_38._M_head_impl = (generic_section_creation_dispatcher *)0x0;
    std::
    back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
    ::operator=((this->out_).ptr_,(value_type *)&local_30);
    if ((generic_section_creation_dispatcher *)local_30._M_head_impl !=
        (generic_section_creation_dispatcher *)0x0) {
      (*((section_creation_dispatcher *)&(local_30._M_head_impl)->_vptr_section_creation_dispatcher)
        ->_vptr_section_creation_dispatcher[1])();
    }
    local_30._M_head_impl = (section_creation_dispatcher *)0x0;
    std::
    unique_ptr<pstore::repo::generic_section_creation_dispatcher,_std::default_delete<pstore::repo::generic_section_creation_dispatcher>_>
    ::~unique_ptr((unique_ptr<pstore::repo::generic_section_creation_dispatcher,_std::default_delete<pstore::repo::generic_section_creation_dispatcher>_>
                   *)&local_38);
    eVar1 = rule::pop(&this->super_rule);
  }
  error_or<pstore::repo::section_content_*>::~error_or(&local_28);
  eVar1._4_4_ = 0;
  return eVar1;
}

Assistant:

std::error_code generic_section<OutputIterator>::end_object () {
                error_or<repo::section_content *> const c = this->content_object ();
                if (!c) {
                    return c.get_error ();
                }
                *out_ = std::make_unique<
                    repo::section_to_creation_dispatcher<repo::generic_section>::type> (kind_,
                                                                                        c.get ());
                return pop ();
            }